

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool (anonymous_namespace)::
     TryGeneratedPaths<cmFindPackageCommand::SearchFrameworkPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmMacProjectDirectoryListGenerator&,(anonymous_namespace)::cmAppendPathSegmentGenerator&,(anonymous_namespace)::cmFileListGeneratorGlob&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator&>
               (anon_class_8_1_8991fb9c *filesCollector,string *startPath,
               cmMacProjectDirectoryListGenerator *gen,cmAppendPathSegmentGenerator *tail,
               cmFileListGeneratorGlob *tail_1,cmCaseInsensitiveDirectoryListGenerator *tail_2)

{
  byte bVar1;
  bool bVar2;
  string local_98;
  int local_64;
  undefined1 local_60 [8];
  string path;
  cmCaseInsensitiveDirectoryListGenerator *tail_local_2;
  cmFileListGeneratorGlob *tail_local_1;
  cmAppendPathSegmentGenerator *tail_local;
  cmMacProjectDirectoryListGenerator *gen_local;
  string *startPath_local;
  anon_class_8_1_8991fb9c *filesCollector_local;
  
  path.field_2._8_8_ = tail_2;
  ResetGenerator<(anonymous_namespace)::cmMacProjectDirectoryListGenerator&>(gen);
  anon_unknown.dwarf_3c8c53::cmDirectoryListGenerator::GetNextCandidate
            ((string *)local_60,&gen->super_cmDirectoryListGenerator,startPath);
  do {
    bVar1 = std::__cxx11::string::empty();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      local_64 = 2;
LAB_00334fa5:
      std::__cxx11::string::~string((string *)local_60);
      if (local_64 != 1) {
        filesCollector_local._7_1_ = 0;
      }
      return (bool)(filesCollector_local._7_1_ & 1);
    }
    ResetGenerator<(anonymous_namespace)::cmAppendPathSegmentGenerator&,(anonymous_namespace)::cmFileListGeneratorGlob&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator&>
              (tail,tail_1,(cmCaseInsensitiveDirectoryListGenerator *)path.field_2._8_8_);
    bVar2 = TryGeneratedPaths<cmFindPackageCommand::SearchFrameworkPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmAppendPathSegmentGenerator&,(anonymous_namespace)::cmFileListGeneratorGlob&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator&>
                      (filesCollector,(string *)local_60,tail,tail_1,
                       (cmCaseInsensitiveDirectoryListGenerator *)path.field_2._8_8_);
    if (bVar2) {
      filesCollector_local._7_1_ = 1;
      local_64 = 1;
      goto LAB_00334fa5;
    }
    anon_unknown.dwarf_3c8c53::cmDirectoryListGenerator::GetNextCandidate
              (&local_98,&gen->super_cmDirectoryListGenerator,startPath);
    std::__cxx11::string::operator=((string *)local_60,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  } while( true );
}

Assistant:

bool TryGeneratedPaths(CallbackFn&& filesCollector,
                       const std::string& startPath, Generator&& gen,
                       Rest&&... tail)
{
  ResetGenerator(std::forward<Generator&&>(gen));
  for (auto path = gen.GetNextCandidate(startPath); !path.empty();
       path = gen.GetNextCandidate(startPath)) {
    ResetGenerator(std::forward<Rest&&>(tail)...);
    if (TryGeneratedPaths(std::forward<CallbackFn&&>(filesCollector), path,
                          std::forward<Rest&&>(tail)...)) {
      return true;
    }
  }
  return false;
}